

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc.c
# Opt level: O0

void etdc_add(etdc_table **table,uint s)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int in_ESI;
  long *in_RDI;
  uint in_stack_0000000c;
  char *_hj_key;
  uint _hj_k;
  uint _hj_j;
  uint _hj_i;
  uint _hf_hashv;
  uint _hf_bkt;
  etdc_table *e;
  char *local_38;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  long local_18;
  char local_c [12];
  
  local_18 = 0;
  if (*in_RDI != 0) {
    local_38 = local_c;
    local_20 = 0xfeedbeef;
    local_28 = 0x9e3779b9;
    local_24 = 0x9e3779b9;
    for (local_2c = 4; 0xb < local_2c; local_2c = local_2c - 0xc) {
      iVar1 = (int)local_38[4] + local_38[5] * 0x100 + local_38[6] * 0x10000 +
              local_38[7] * 0x1000000 + local_28;
      local_20 = (int)local_38[8] + local_38[9] * 0x100 + local_38[10] * 0x10000 +
                 local_38[0xb] * 0x1000000 + local_20;
      uVar2 = local_20 >> 0xd ^
              (((int)*local_38 + local_38[1] * 0x100 + local_38[2] * 0x10000 +
                local_38[3] * 0x1000000 + local_24) - iVar1) - local_20;
      uVar3 = uVar2 << 8 ^ (iVar1 - local_20) - uVar2;
      uVar4 = uVar3 >> 0xd ^ (local_20 - uVar2) - uVar3;
      uVar2 = uVar4 >> 0xc ^ (uVar2 - uVar3) - uVar4;
      uVar3 = uVar2 << 0x10 ^ (uVar3 - uVar4) - uVar2;
      uVar4 = uVar3 >> 5 ^ (uVar4 - uVar2) - uVar3;
      local_24 = uVar4 >> 3 ^ (uVar2 - uVar3) - uVar4;
      local_28 = local_24 << 10 ^ (uVar3 - uVar4) - local_24;
      local_20 = local_28 >> 0xf ^ (uVar4 - local_24) - local_28;
      local_38 = local_38 + 0xc;
    }
    local_20 = local_20 + 4;
    switch(local_2c) {
    case 8:
      local_28 = (int)local_38[4] +
                 local_38[5] * 0x100 + local_38[6] * 0x10000 + local_38[7] * 0x1000000 + local_28;
    case 4:
      local_24 = (int)*local_38 +
                 local_38[1] * 0x100 + local_38[2] * 0x10000 + local_38[3] * 0x1000000 + local_24;
    default:
      uVar2 = local_20 >> 0xd ^ (local_24 - local_28) - local_20;
      uVar3 = uVar2 << 8 ^ (local_28 - local_20) - uVar2;
      uVar4 = uVar3 >> 0xd ^ (local_20 - uVar2) - uVar3;
      uVar2 = uVar4 >> 0xc ^ (uVar2 - uVar3) - uVar4;
      uVar3 = uVar2 << 0x10 ^ (uVar3 - uVar4) - uVar2;
      uVar4 = uVar3 >> 5 ^ (uVar4 - uVar2) - uVar3;
      uVar2 = uVar4 >> 3 ^ (uVar2 - uVar3) - uVar4;
      uVar3 = uVar2 << 10 ^ (uVar3 - uVar4) - uVar2;
      uVar2 = (uVar3 >> 0xf ^ (uVar4 - uVar2) - uVar3) &
              *(int *)(*(long *)(*in_RDI + 0x18) + 8) - 1U;
      if (*(long *)(**(long **)(*in_RDI + 0x18) + (ulong)uVar2 * 0x10) == 0) {
        local_18 = 0;
      }
      else {
        local_18 = *(long *)(**(long **)(*in_RDI + 0x18) + (ulong)uVar2 * 0x10) -
                   *(long *)(*(long *)(*in_RDI + 0x18) + 0x20);
      }
      while ((local_18 != 0 &&
             ((*(int *)(local_18 + 0x48) != 4 || (**(int **)(local_18 + 0x40) != in_ESI))))) {
        if (*(long *)(local_18 + 0x38) == 0) {
          local_18 = 0;
        }
        else {
          local_18 = *(long *)(local_18 + 0x38) - *(long *)(*(long *)(*in_RDI + 0x18) + 0x20);
        }
      }
    }
  }
  if (local_18 == 0) {
    etdc_new_symbol((etdc_table **)_hj_key,in_stack_0000000c);
  }
  else {
    *(int *)(local_18 + 4) = *(int *)(local_18 + 4) + 1;
  }
  return;
}

Assistant:

void etdc_add(struct etdc_table **table, unsigned int s) {
  struct etdc_table *e;

  HASH_FIND_INT( *table, &s, e);

  if (NULL == e) {
    //add symbol to table
    //fprintf(stderr,"No symbol found in table... creating one");
    etdc_new_symbol(table, s);
  } else {
    //increment frequency
    //fprintf(stderr,"Incrementing frequency of symbol in etdc table");
    e->freq++;
  }
}